

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void __thiscall TCMallocTest_Realloc_Test::TestBody(TCMallocTest_Realloc_Test *this)

{
  undefined8 uVar1;
  char cVar2;
  TestingPortal *pTVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  size_t __size;
  long local_78;
  code *local_60;
  void *p;
  void *new_p;
  code *local_48;
  AssertionResult gtest_ar;
  
  pTVar3 = tcmalloc::TestingPortal::Get();
  cVar2 = (**(code **)(*(long *)pTVar3 + 8))(pTVar3);
  if (cVar2 == '\0') {
    pTVar3 = tcmalloc::TestingPortal::Get();
    puVar4 = (undefined8 *)(**(code **)(*(long *)pTVar3 + 0x28))(pTVar3);
    uVar1 = *puVar4;
    *puVar4 = 0;
    lVar8 = 8;
    local_78 = 0;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      __size = (size_t)(int)(&DAT_0013a060)[lVar5];
      local_48 = (code *)malloc(__size);
      (*noopt_helper)((internal *)&local_48);
      local_60 = local_48;
      p = (void *)0x0;
      testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                ((internal *)&local_48,"p","nullptr",&local_60,&p);
      if (local_48._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&p);
        if (gtest_ar._0_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x2d1,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,(Message *)&p)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )p;
LAB_0010cf22:
        if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )0x0) {
          (**(code **)(*(long *)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar);
        break;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar);
      for (lVar6 = 0; lVar8 != lVar6; lVar6 = lVar6 + 4) {
        local_48 = realloc;
        (*noopt_helper)((internal *)&local_48);
        p = (void *)(*local_48)(local_60,(long)*(int *)((long)&DAT_0013b410 + lVar6) + __size);
        testing::internal::CmpHelperEQ<void*,void*>((internal *)&local_48,"p","new_p",&local_60,&p);
        if (local_48._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&gtest_ar.message_);
          if (gtest_ar._0_8_ == 0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&new_p,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                     ,0x2d5,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&new_p,(Message *)&gtest_ar.message_);
          goto LAB_0010cf15;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar);
      }
      lVar6 = 0;
LAB_0010cdf6:
      if (local_78 != lVar6) {
        local_48 = realloc;
        (*noopt_helper)((internal *)&local_48);
        p = (void *)(*local_48)(local_60,__size - (long)*(int *)((long)&DAT_0013b410 + lVar6));
        testing::internal::CmpHelperEQ<void*,void*>((internal *)&local_48,"p","new_p",&local_60,&p);
        if (local_48._0_1_ != (internal)0x0) goto code_r0x0010ce52;
        testing::Message::Message((Message *)&gtest_ar.message_);
        if (gtest_ar._0_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&new_p,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x2da,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&new_p,(Message *)&gtest_ar.message_);
LAB_0010cf15:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&new_p);
        goto LAB_0010cf22;
      }
      free(local_60);
      lVar8 = lVar8 + 8;
      local_78 = local_78 + 8;
    }
    *puVar4 = uVar1;
  }
  return;
code_r0x0010ce52:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  lVar6 = lVar6 + 4;
  goto LAB_0010cdf6;
}

Assistant:

TEST(TCMallocTest, Realloc) {
  if (TestingPortal::Get()->IsDebuggingMalloc()) {
    // debug alloc doesn't try to minimize reallocs
    return;
  }
  // When sampling, we always allocate in units of page-size, which
  // makes reallocs of small sizes do extra work (thus, failing these
  // checks).  Since sampling is random, we turn off sampling to make
  // sure that doesn't happen to us here.

  // turn off sampling
  tcmalloc::Cleanup cleanup = SetFlag(&TestingPortal::Get()->GetSampleParameter(), 0);

  int start_sizes[] = { 100, 1000, 10000, 100000 };
  int deltas[] = { 1, -2, 4, -8, 16, -32, 64, -128 };

  for (int s = 0; s < sizeof(start_sizes)/sizeof(*start_sizes); ++s) {
    void* p = noopt(malloc(start_sizes[s]));
    ASSERT_NE(p, nullptr);
    // The larger the start-size, the larger the non-reallocing delta.
    for (int d = 0; d < (s+1) * 2; ++d) {
      void* new_p = noopt(realloc)(p, start_sizes[s] + deltas[d]);
      ASSERT_EQ(p, new_p);  // realloc should not allocate new memory
    }
    // Test again, but this time reallocing smaller first.
    for (int d = 0; d < s*2; ++d) {
      void* new_p = noopt(realloc)(p, start_sizes[s] - deltas[d]);
      ASSERT_EQ(p, new_p);  // realloc should not allocate new memory
    }
    free(p);
  }
}